

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O2

UniValue * BanMapToJson(UniValue *__return_storage_ptr__,banmap_t *bans)

{
  string str;
  string key;
  UniValue val;
  UniValue val_00;
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe50;
  _Rb_tree_node_base *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe58;
  undefined1 auVar3 [32];
  undefined1 in_stack_fffffffffffffe68 [56];
  undefined1 in_stack_fffffffffffffea0 [32];
  UniValue local_128;
  string local_d0 [32];
  UniValue j;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_string_length = in_stack_fffffffffffffe50;
  str._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  str.field_2 = in_stack_fffffffffffffe58;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_58);
  p_Var2 = &(bans->_M_t)._M_impl.super__Rb_tree_header._M_header;
  for (p_Var1 = (bans->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; p_Var1 != p_Var2;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    CBanEntry::ToJson(&j,(CBanEntry *)&p_Var1[2]._M_right);
    std::__cxx11::string::string<std::allocator<char>>
              (local_d0,"address",(allocator<char> *)&stack0xfffffffffffffe5f);
    CSubNet::ToString_abi_cxx11_((string *)&stack0xfffffffffffffeb8,(CSubNet *)(p_Var1 + 1));
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_128,(string *)&stack0xfffffffffffffeb8);
    key._M_string_length = (size_type)p_Var2;
    key._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    key.field_2 = in_stack_fffffffffffffe58;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffea0._0_8_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffea0._8_24_;
    auVar3 = in_stack_fffffffffffffe68._8_32_;
    val_00.typ = in_stack_fffffffffffffe68._0_4_;
    val_00._4_4_ = in_stack_fffffffffffffe68._4_4_;
    val_00.val._M_dataplus._M_p = (pointer)auVar3._0_8_;
    val_00.val._M_string_length = auVar3._8_8_;
    val_00.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar3._16_16_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe68._40_8_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe68._48_8_;
    UniValue::pushKV(&j,key,val_00);
    UniValue::~UniValue(&local_128);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    std::__cxx11::string::~string(local_d0);
    UniValue::UniValue((UniValue *)&stack0xfffffffffffffe60,&j);
    val.val._M_dataplus._M_p = (pointer)p_Var2;
    val._0_8_ = __return_storage_ptr__;
    val.val._8_16_ = in_stack_fffffffffffffe58;
    val._32_56_ = in_stack_fffffffffffffe68;
    UniValue::push_back(__return_storage_ptr__,val);
    UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe60);
    UniValue::~UniValue(&j);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue BanMapToJson(const banmap_t& bans)
{
    UniValue bans_json(UniValue::VARR);
    for (const auto& it : bans) {
        const auto& address = it.first;
        const auto& ban_entry = it.second;
        UniValue j = ban_entry.ToJson();
        j.pushKV(BANMAN_JSON_ADDR_KEY, address.ToString());
        bans_json.push_back(std::move(j));
    }
    return bans_json;
}